

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_bool_decoder(MACROBLOCKD *xd,uint8_t *data,uint8_t *data_end,size_t read_size,
                       aom_internal_error_info *error_info,aom_reader *r,uint8_t allow_update_cdf)

{
  int iVar1;
  size_t in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  undefined4 *in_RDI;
  aom_internal_error_info *in_R8;
  uint8_t *in_R9;
  size_t in_stack_ffffffffffffffc8;
  
  iVar1 = read_is_valid(in_RSI,in_RCX,in_RDX);
  if (iVar1 == 0) {
    *in_RDI = in_RDI[0x7a8];
    aom_internal_error(in_R8,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile length");
  }
  iVar1 = aom_reader_init((aom_reader *)in_R8,in_R9,in_stack_ffffffffffffffc8);
  if (iVar1 != 0) {
    *in_RDI = in_RDI[0x7a8];
    aom_internal_error(in_R8,AOM_CODEC_MEM_ERROR,"Failed to allocate bool decoder %d",1);
  }
  in_R9[0x38] = (uint8_t)r;
  return;
}

Assistant:

static inline void setup_bool_decoder(
    MACROBLOCKD *const xd, const uint8_t *data, const uint8_t *data_end,
    const size_t read_size, struct aom_internal_error_info *error_info,
    aom_reader *r, uint8_t allow_update_cdf) {
  // Validate the calculated partition length. If the buffer
  // described by the partition can't be fully read, then restrict
  // it to the portion that can be (for EC mode) or throw an error.
  if (!read_is_valid(data, read_size, data_end)) {
    // When internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done in row-mt decoding.
    xd->mi_row = xd->tile.mi_row_start;

    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile length");
  }
  if (aom_reader_init(r, data, read_size)) {
    // When internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done in row-mt decoding.
    xd->mi_row = xd->tile.mi_row_start;

    aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate bool decoder %d", 1);
  }

  r->allow_update_cdf = allow_update_cdf;
}